

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O0

void ncnn::conv_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_size)

{
  float *pfVar1;
  int in_ECX;
  int in_EDX;
  Mat *in_RDI;
  int in_R8D;
  int q_1;
  float *ktmp_1;
  float *k0_1;
  int p_1;
  int q;
  float *ktmp;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  float *kernel;
  Allocator *in_stack_fffffffffffffed0;
  Mat *pMVar2;
  Mat *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef4;
  int iVar3;
  Mat local_108;
  Mat *local_c8;
  float *local_c0;
  int local_b4;
  int local_b0;
  Mat local_a0;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  float *local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_28 = Mat::operator_cast_to_float_(in_RDI);
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffef4,local_14),
              (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8,iVar3,
              (size_t)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  local_2c = local_18 >> 2;
  local_30 = local_2c << 2;
  for (local_34 = 0; local_34 < local_2c; local_34 = local_34 + 1) {
    local_38 = local_34 * 4;
    local_40 = local_28 + local_38 * local_14 * local_1c;
    local_48 = local_28 + (local_38 + 1) * local_14 * local_1c;
    local_50 = local_28 + (local_38 + 2) * local_14 * local_1c;
    local_58 = local_28 + (local_38 + 3) * local_14 * local_1c;
    pMVar2 = &local_a0;
    Mat::channel(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    pfVar1 = Mat::operator_cast_to_float_(pMVar2);
    Mat::~Mat((Mat *)0x148bad);
    local_60 = pfVar1;
    for (local_b0 = 0; local_b0 < local_14 * local_1c; local_b0 = local_b0 + 1) {
      *local_60 = *local_40;
      local_60[1] = *local_48;
      local_60[2] = *local_50;
      local_60[3] = *local_58;
      local_60 = local_60 + 4;
      local_40 = local_40 + 1;
      local_48 = local_48 + 1;
      local_50 = local_50 + 1;
      local_58 = local_58 + 1;
    }
  }
  for (local_b4 = local_30; local_b4 < local_18; local_b4 = local_b4 + 1) {
    local_c0 = local_28 + local_b4 * local_14 * local_1c;
    pMVar2 = &local_108;
    Mat::channel(in_stack_fffffffffffffed8,(int)((ulong)pMVar2 >> 0x20));
    in_stack_fffffffffffffed8 = (Mat *)Mat::operator_cast_to_float_(pMVar2);
    Mat::~Mat((Mat *)0x148da0);
    local_c8 = in_stack_fffffffffffffed8;
    for (iVar3 = 0; iVar3 < local_14 * local_1c; iVar3 = iVar3 + 1) {
      *(float *)&local_c8->data = *local_c0;
      local_c8 = (Mat *)((long)&local_c8->data + 4);
      local_c0 = local_c0 + 1;
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_size)
{
    const float* kernel = _kernel;

    // kernel memory packed 4 x 4
    kernel_tm.create(4*kernel_size, inch, outch/4 + outch%4);
    
    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;
    remain_outch_start = nn_outch << 2;

    for (int pp=0; pp<nn_outch; pp++)
    {
        int p = pp * 4;

        const float* k0 = kernel + (p+0)*inch*kernel_size;
        const float* k1 = kernel + (p+1)*inch*kernel_size;
        const float* k2 = kernel + (p+2)*inch*kernel_size;
        const float* k3 = kernel + (p+3)*inch*kernel_size;

        float* ktmp = kernel_tm.channel(p/4);

        for (int q=0; q<inch*kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp += 4;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
        }
    }
    
    for (int p=remain_outch_start; p<outch; p++)
    {
        const float* k0 = kernel + (p+0)*inch*kernel_size;

        float* ktmp = kernel_tm.channel(p/4 + p%4);

        for (int q=0; q<inch*kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp++;
            k0++;
        }
    }
}